

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.h
# Opt level: O0

void __thiscall
pbrt::SceneEntity::SceneEntity
          (SceneEntity *this,string *name,ParameterDictionary *parameters,FileLoc loc)

{
  ParameterDictionary *in_RDX;
  string *in_RSI;
  ParameterDictionary *in_RDI;
  ParsedParameter *in_stack_00000008;
  ParsedParameter *in_stack_00000010;
  ParsedParameter *in_stack_00000018;
  ParameterDictionary *pPVar1;
  
  pPVar1 = in_RDI;
  std::__cxx11::string::string((string *)in_RDI,in_RSI);
  ParameterDictionary::ParameterDictionary(in_RDX,pPVar1);
  in_RDI[1].params.field_2.fixed[2] = in_stack_00000008;
  in_RDI[1].params.field_2.fixed[3] = in_stack_00000010;
  in_RDI[1].params.field_2.fixed[4] = in_stack_00000018;
  return;
}

Assistant:

SceneEntity(const std::string &name, ParameterDictionary parameters, FileLoc loc)
        : name(name), parameters(parameters), loc(loc) {}